

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtpSession.cpp
# Opt level: O0

void __thiscall gnl::FtpSession::printOpendirErrorMesg(FtpSession *this)

{
  undefined8 uVar1;
  int *piVar2;
  FtpSession *this_local;
  
  uVar1 = std::__cxx11::string::c_str();
  printf("Error openning directory \"%s\", error was:\n  ",uVar1);
  piVar2 = __errno_location();
  switch(*piVar2) {
  case 2:
    printf("Directory does not exist, or is an empty string.\n");
    break;
  case 0xc:
    printf("Insufficient memory to complete the operation..\n");
    break;
  case 0xd:
    printf("Access denied.\n");
    break;
  case 0x14:
  default:
    uVar1 = std::__cxx11::string::c_str();
    printf("\"%s\" is not a directory.\n",uVar1);
    break;
  case 0x17:
    printf("Too many files are currently open in the system.\n");
    break;
  case 0x18:
    printf("Too many file descriptors in use by process.\n");
  }
  return;
}

Assistant:

void FtpSession::printOpendirErrorMesg(){
        printf("Error openning directory \"%s\", error was:\n  ",mWorkingDirectory.c_str());
        switch(errno) {
            case EACCES:
                printf("Access denied.\n");
                break;
            case EMFILE:
                printf("Too many file descriptors in use by process.\n");
                break;
            case ENFILE:
                printf("Too many files are currently open in the system.\n");
                break;
            case ENOENT:
                printf("Directory does not exist, or is an empty string.\n");
                break;
            case ENOMEM:
                printf("Insufficient memory to complete the operation..\n");
                break ;
            case ENOTDIR:
            default:
                printf("\"%s\" is not a directory.\n",mWorkingDirectory.c_str());
                break ;
        }
    }